

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo::InternalSwap(GeneratedCodeInfo *this,GeneratedCodeInfo *other)

{
  undefined4 uVar1;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  long in_RSI;
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *in_RDI;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_ffffffffffffff68;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_ffffffffffffffa0;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 8);
  uVar1 = (in_RDI->super_RepeatedPtrFieldBase).current_size_;
  if ((uVar1 & 1) != 1) {
    in_stack_ffffffffffffffa0 = this_00;
    if (((uint)*(undefined8 *)this_00 & 1) != 1) goto LAB_00532a7a;
  }
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (this_00);
    in_stack_ffffffffffffff68 = this_00;
  }
  else {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow
              ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff68 = this_00;
  }
  internal::InternalMetadataWithArena::DoSwap
            ((InternalMetadataWithArena *)in_RDI,(UnknownFieldSet *)in_stack_ffffffffffffff68);
LAB_00532a7a:
  std::swap<unsigned_int>
            ((uint *)&(in_RDI->super_RepeatedPtrFieldBase).rep_,(uint *)(in_RSI + 0x10));
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::InternalSwap
            (in_RDI,(RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)
                    in_stack_ffffffffffffff68);
  return;
}

Assistant:

void GeneratedCodeInfo::InternalSwap(GeneratedCodeInfo* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  annotation_.InternalSwap(&other->annotation_);
}